

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_adynarray.c
# Opt level: O1

void test_ADynArray_reserve_success_notEnoughCapacity_fn(int _i)

{
  bool bVar1;
  ulong uVar2;
  char *pcVar3;
  int iVar4;
  char *pcVar5;
  char *pcVar6;
  size_t sVar7;
  char *pcVar8;
  long lVar9;
  undefined8 uVar10;
  private_ACUtilsTest_ADynArray_CharArray array;
  
  array.buffer = (char *)0x0;
  array.reallocator._0_4_ = 0x10a480;
  array.reallocator._4_4_ = 0;
  array.deallocator._0_4_ = 0x10a4c0;
  array.deallocator._4_4_ = 0;
  array.size = 8;
  array.growStrategy = private_ACUtilsTest_ADynArray_growStrategy;
  array.capacity = 8;
  private_ACUtilsTest_ADynArray_reallocFail = 0;
  array.buffer = (char *)private_ACUtilsTest_ADynArray_realloc((void *)0x0,8);
  if (array.size != 1) {
    uVar2 = 0;
    do {
      array.buffer[uVar2] = '5';
      uVar2 = uVar2 + 1;
    } while (uVar2 < array.size - 1);
  }
  array.buffer[array.size - 1] = '0';
  private_ACUtilsTest_ADynArray_reallocCount = 0;
  bVar1 = private_ACUtils_ADynArray_reserve(&array,0x20,false,1);
  if (bVar1 == true) {
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                ,0xf3);
    if (array.size != 8) {
      pcVar8 = "private_ACUtilsTest_ADynArray_capacityMin";
      pcVar3 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
      pcVar5 = "array.size == private_ACUtilsTest_ADynArray_capacityMin";
      pcVar6 = "array.size";
      iVar4 = 0xf4;
      uVar10 = 8;
      sVar7 = array.size;
      goto LAB_0010b50e;
    }
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                ,0xf4);
    if (array.capacity != 0x20) {
      pcVar8 = "private_ACUtilsTest_ADynArray_capacityMax";
      pcVar3 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
      pcVar5 = "array.capacity == private_ACUtilsTest_ADynArray_capacityMax";
      pcVar6 = "array.capacity";
      iVar4 = 0xf5;
      uVar10 = 0x20;
      sVar7 = array.capacity;
      goto LAB_0010b50e;
    }
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                ,0xf5);
    if (array.buffer == (char *)0x0) {
      pcVar5 = "(void*) array.buffer != NULL";
      pcVar6 = "(void*) array.buffer";
      iVar4 = 0xf6;
LAB_0010b661:
      _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                        ,iVar4,"Assertion \'_ck_x != NULL\' failed",
                        "Assertion \'%s\' failed: %s == %#x",pcVar5,pcVar6,0,0);
    }
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                ,0xf6);
    lVar9 = 0;
    do {
      if ((long)array.buffer[lVar9] != 0x35) {
        pcVar8 = "\'5\'";
        pcVar3 = "Assertion \'%s\' failed: %s == %jd, %s == %jd";
        pcVar5 = "array.buffer[i] == \'5\'";
        pcVar6 = "array.buffer[i]";
        iVar4 = 0xf8;
        uVar10 = 0x35;
        sVar7 = (long)array.buffer[lVar9];
        goto LAB_0010b50e;
      }
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                  ,0xf8);
      lVar9 = lVar9 + 1;
    } while (lVar9 != 7);
    if ((long)array.buffer[7] != 0x30) {
      pcVar8 = "\'0\'";
      pcVar3 = "Assertion \'%s\' failed: %s == %jd, %s == %jd";
      pcVar5 = "array.buffer[private_ACUtilsTest_ADynArray_capacityMin - 1] == \'0\'";
      pcVar6 = "array.buffer[private_ACUtilsTest_ADynArray_capacityMin - 1]";
      iVar4 = 0xf9;
      uVar10 = 0x30;
      sVar7 = (long)array.buffer[7];
      goto LAB_0010b50e;
    }
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                ,0xf9);
    if (array.growStrategy == (ACUtilsGrowStrategy)0x0) {
      pcVar5 = "(void*) array.growStrategy != NULL";
      pcVar6 = "(void*) array.growStrategy";
      iVar4 = 0xfa;
      goto LAB_0010b661;
    }
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                ,0xfa);
    if (private_ACUtilsTest_ADynArray_reallocCount == 1) {
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                  ,0xfb);
      (*(code *)CONCAT44(array.deallocator._4_4_,array.deallocator._0_4_))(array.buffer);
      return;
    }
    pcVar8 = "1";
    pcVar5 = "private_ACUtilsTest_ADynArray_reallocCount == 1";
    pcVar6 = "private_ACUtilsTest_ADynArray_reallocCount";
    iVar4 = 0xfb;
    sVar7 = private_ACUtilsTest_ADynArray_reallocCount;
  }
  else {
    sVar7 = (size_t)bVar1;
    pcVar8 = "true";
    pcVar5 = 
    "private_ACUtils_ADynArray_reserve(&array, private_ACUtilsTest_ADynArray_capacityMax, false, sizeof(*(&array)->buffer)) == true"
    ;
    pcVar6 = 
    "private_ACUtils_ADynArray_reserve(&array, private_ACUtilsTest_ADynArray_capacityMax, false, sizeof(*(&array)->buffer))"
    ;
    iVar4 = 0xf3;
  }
  pcVar3 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
  uVar10 = 1;
LAB_0010b50e:
  _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                    ,iVar4,"Assertion \'_ck_x == _ck_y\' failed",pcVar3,pcVar5,pcVar6,sVar7,pcVar8,
                    uVar10,0);
}

Assistant:

END_TEST
START_TEST(test_ADynArray_reserve_success_notEnoughCapacity)
{
    size_t i;
    struct private_ACUtilsTest_ADynArray_CharArray array = {.reallocator = private_ACUtilsTest_ADynArray_realloc, .deallocator = private_ACUtilsTest_ADynArray_free};
    array.size = private_ACUtilsTest_ADynArray_capacityMin;
    array.growStrategy = private_ACUtilsTest_ADynArray_growStrategy;
    array.capacity = private_ACUtilsTest_ADynArray_capacityMin;
    private_ACUtilsTest_ADynArray_reallocFail = false;
    array.buffer = (char*) array.reallocator(nullptr, array.capacity);
    for(i = 0; i < array.size - 1; ++i)
        array.buffer[i] = '5';
    array.buffer[array.size - 1] = '0';
    private_ACUtilsTest_ADynArray_reallocCount = 0;
    ACUTILSTEST_ASSERT_UINT_EQ(ADynArray_reserve(&array, private_ACUtilsTest_ADynArray_capacityMax), true);
    ACUTILSTEST_ASSERT_UINT_EQ(array.size, private_ACUtilsTest_ADynArray_capacityMin);
    ACUTILSTEST_ASSERT_UINT_EQ(array.capacity, private_ACUtilsTest_ADynArray_capacityMax);
    ACUTILSTEST_ASSERT_PTR_NONNULL(array.buffer);
    for(i = 0; i < private_ACUtilsTest_ADynArray_capacityMin - 1; ++i)
        ACUTILSTEST_ASSERT_INT_EQ(array.buffer[i], '5');
    ACUTILSTEST_ASSERT_INT_EQ(array.buffer[private_ACUtilsTest_ADynArray_capacityMin - 1], '0');
    ACUTILSTEST_ASSERT_PTR_NONNULL(array.growStrategy);
    ACUTILSTEST_ASSERT_UINT_EQ(private_ACUtilsTest_ADynArray_reallocCount, 1);
    array.deallocator(array.buffer);
}